

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::
treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::BSTerase(treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,iterator *position)

{
  node *pnVar1;
  node *u;
  node *v;
  RBTree<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *v_00;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar2;
  Colour CVar3;
  node *v_01;
  undefined1 local_48 [8];
  iterator temp;
  
  pnVar1 = (this->m_tree).NIL;
  ((this->m_tree).m_first)->parent->left = pnVar1;
  ((this->m_tree).m_last)->parent->right = pnVar1;
  u = position->m_node;
  CVar3 = u->colour;
  v = u->left;
  v_01 = u->right;
  if (v == pnVar1) {
    transplant(this,u,v_01);
  }
  else if (v_01 == pnVar1) {
    transplant(this,u,v);
    v_01 = v;
  }
  else {
    local_48 = (undefined1  [8])&PTR__treeIterator_00118820;
    temp._vptr_treeIterator = (_func_int **)position->m_tree;
    temp.m_tree = (RBTree<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)u;
    treeIterator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((treeIterator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_48);
    v_00 = temp.m_tree;
    CVar3 = *(Colour *)&temp.m_tree[1].NIL;
    v_01 = temp.m_tree[1].m_first;
    ptVar2 = v_01;
    if (temp.m_tree[1].m_last != u) {
      transplant(this,(node *)temp.m_tree,v_01);
      ptVar2 = u->right;
      v_00[1].m_first = ptVar2;
    }
    ptVar2->parent =
         (treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)v_00;
    transplant(this,u,(node *)v_00);
    ptVar2 = u->left;
    v_00[1].m_root = ptVar2;
    ptVar2->parent =
         (treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)v_00;
    *(Colour *)&v_00[1].NIL = u->colour;
  }
  std::__cxx11::string::~string((string *)&(u->value).second);
  operator_delete(u);
  if (CVar3 == BLACK) {
    fixEraseViolation(this,v_01);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}